

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O1

void lrit::to_json(json *j,ImageStructureHeader *h)

{
  value_t t;
  json_value jVar1;
  long lVar2;
  initializer_list_t init;
  initializer_list_t init_00;
  initializer_list_t init_01;
  initializer_list_t init_02;
  initializer_list_t init_03;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_1c0;
  value_t local_1a0 [8];
  ulong local_198;
  value_t *local_190;
  undefined1 local_188;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_180;
  value_t local_160 [8];
  ulong local_158;
  value_t *local_150;
  undefined1 local_148;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_140;
  value_t local_120 [8];
  ulong local_118;
  value_t *local_110;
  undefined1 local_108;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_100;
  value_t local_e0 [8];
  ulong local_d8;
  value_t *local_d0;
  undefined1 local_c8;
  undefined1 local_c0 [8];
  json_value local_b8;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_b0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_90;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_80;
  undefined1 local_78;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_70;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_60;
  undefined1 local_58;
  undefined1 local_50 [16];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_40;
  undefined1 local_38;
  
  local_100.owned_value.m_value.object = (object_t *)0x0;
  local_100.owned_value.m_type = string;
  local_100.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[13]>((char (*) [13])"BitsPerPixel");
  local_100.value_ref = &local_100.owned_value;
  local_100.is_rvalue = true;
  local_d0 = local_e0;
  local_d8 = (ulong)h->bitsPerPixel;
  local_e0[0] = number_integer;
  local_c8 = 1;
  init._M_len = 2;
  init._M_array = (iterator)local_100.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_b0.owned_value,init,true,array);
  local_b0.value_ref = &local_b0.owned_value;
  local_b0.is_rvalue = true;
  local_140.owned_value.m_value.object = (object_t *)0x0;
  local_140.owned_value.m_type = string;
  local_140.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[8]>((char (*) [8])"Columns");
  local_140.value_ref = &local_140.owned_value;
  local_140.is_rvalue = true;
  local_110 = local_120;
  local_118 = (ulong)h->columns;
  local_120[0] = number_integer;
  local_108 = 1;
  init_00._M_len = 2;
  init_00._M_array = (iterator)local_140.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_90,init_00,true,array);
  local_78 = 1;
  local_180.owned_value.m_value.object = (object_t *)0x0;
  local_180.owned_value.m_type = string;
  local_80 = &local_90;
  local_180.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[6]>((char (*) [6])"Lines");
  local_180.value_ref = &local_180.owned_value;
  local_180.is_rvalue = true;
  local_150 = local_160;
  local_158 = (ulong)h->lines;
  local_160[0] = number_integer;
  local_148 = 1;
  init_01._M_len = 2;
  init_01._M_array = (iterator)local_180.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_70,init_01,true,array);
  local_58 = 1;
  local_1c0.owned_value.m_value.object = (object_t *)0x0;
  local_1c0.owned_value.m_type = string;
  local_60 = &local_70;
  local_1c0.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[12]>((char (*) [12])0x122548);
  local_1c0.value_ref = &local_1c0.owned_value;
  local_1c0.is_rvalue = true;
  local_190 = local_1a0;
  local_198 = (ulong)h->compression;
  local_1a0[0] = number_integer;
  local_188 = 1;
  init_02._M_len = 2;
  init_02._M_array = (iterator)local_1c0.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_50,init_02,true,array);
  local_38 = 1;
  init_03._M_len = 4;
  init_03._M_array = &local_b0;
  local_40 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_50;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_c0,init_03,true,array);
  t = j->m_type;
  j->m_type = local_c0[0];
  jVar1 = j->m_value;
  j->m_value = local_b8;
  local_c0[0] = t;
  local_b8 = jVar1;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_c0 + 8),t);
  lVar2 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_50 + lVar2 + 8),local_50[lVar2]);
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x80);
  lVar2 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_198 + lVar2),local_1a0[lVar2]);
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  lVar2 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_158 + lVar2),local_160[lVar2]);
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  lVar2 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_118 + lVar2),local_120[lVar2]);
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  lVar2 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_d8 + lVar2),local_e0[lVar2]);
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  return;
}

Assistant:

void to_json(json& j, const ImageStructureHeader& h) {
  j = {
      {"BitsPerPixel", int(h.bitsPerPixel)},
      {"Columns", int(h.columns)},
      {"Lines", int(h.lines)},
      {"Compression", int(h.compression)},
  };
}